

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

int event_changelist_assert_ok_foreach_iter_fn(event_base *base,int fd,evmap_io *io,void *arg)

{
  long lVar1;
  
  lVar1 = (long)*(int *)&io[1].events.lh_first;
  if ((lVar1 != 0) && ((base->changelist).changes[lVar1 + -1].fd != fd)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
               ,0x2e9,"c->fd == fd","event_changelist_assert_ok_foreach_iter_fn",lVar1 * 0xc);
  }
  return 0;
}

Assistant:

static int
event_changelist_assert_ok_foreach_iter_fn(
	struct event_base *base,
	evutil_socket_t fd, struct evmap_io *io, void *arg)
{
	struct event_changelist *changelist = &base->changelist;
	struct event_changelist_fdinfo *f;
	f = (void*)
	    ( ((char*)io) + sizeof(struct evmap_io) );
	if (f->idxplus1) {
		struct event_change *c = &changelist->changes[f->idxplus1 - 1];
		EVUTIL_ASSERT(c->fd == fd);
	}
	return 0;
}